

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_dictionary.cpp
# Opt level: O1

PreparedDictionary *
duckdb_brotli::CreatePreparedDictionary(MemoryManager *m,uint8_t *source,size_t source_size)

{
  long lVar1;
  void *__s;
  short sVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  void *p;
  ulong uVar8;
  PreparedDictionary *pPVar9;
  byte bVar10;
  byte bVar11;
  void *pvVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint32_t uVar16;
  size_t n;
  uint uVar17;
  long lVar18;
  ushort uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  undefined4 uVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  
  if (source_size < 0x200001) {
    uVar22 = 0x11;
    uVar24 = 7;
  }
  else {
    uVar7 = 0x200000;
    uVar22 = 0x11;
    do {
      uVar24 = uVar22;
      uVar22 = uVar24 + 1;
      uVar7 = uVar7 * 2;
      if (source_size <= uVar7) break;
    } while (uVar24 < 0x15);
    uVar24 = uVar24 - 9;
  }
  bVar10 = (byte)uVar24;
  uVar14 = 1 << (bVar10 & 0x1f);
  bVar11 = (byte)uVar22;
  lVar26 = 2L << (bVar11 & 0x3f);
  if (uVar22 - uVar24 < 0x10 && (uVar24 <= uVar22 && uVar24 < 0x11)) {
    n = (4L << (bVar11 & 0x3f)) + lVar26 + (8L << (bVar10 & 0x3f)) + source_size * 4;
    if (n == 0) {
      p = (void *)0x0;
    }
    else {
      p = BrotliAllocate(m,n);
    }
    uVar7 = (ulong)uVar14;
    __s = (void *)((long)p + uVar7 * 8);
    uVar25 = (ulong)(uint)(1 << (bVar11 & 0x1f));
    uVar15 = 0;
    switchD_0105dc25::default(__s,0,uVar25 * 2);
    if (7 < source_size) {
      uVar6 = 8;
      do {
        uVar17 = uVar6 - 8;
        uVar8 = (*(ulong *)(source + uVar17) & 0xffffffffff) * 0x1fe35a7bd3579bd3 >>
                (0x40 - bVar11 & 0x3f) & 0xffffffff;
        sVar2 = *(short *)((long)__s + uVar8 * 2);
        if (sVar2 == 0) {
          uVar23 = 0xffffffff;
        }
        else {
          uVar23 = *(undefined4 *)((long)__s + uVar8 * 4 + uVar25 * 2);
        }
        *(undefined4 *)((long)__s + (ulong)uVar17 * 4 + uVar25 * 6) = uVar23;
        *(uint *)((long)__s + uVar8 * 4 + uVar25 * 2) = uVar17;
        uVar19 = sVar2 + 1;
        if (0x1f < uVar19) {
          uVar19 = 0x20;
        }
        *(ushort *)((long)__s + uVar8 * 2) = uVar19;
        uVar8 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar8 < source_size);
    }
    uVar13 = 0;
    uVar8 = uVar7;
    pvVar12 = __s;
    do {
      *(undefined4 *)((long)p + uVar13 * 4 + uVar7 * 4) = 0x20;
      uVar6 = 0x20;
      while( true ) {
        if (uVar13 < uVar25) {
          lVar18 = 0;
          uVar20 = 0;
          bVar4 = false;
          do {
            uVar17 = uVar20;
            bVar3 = true;
            if (uVar20 < 0xffff) {
              uVar17 = (uint)*(ushort *)((long)pvVar12 + lVar18 * 2);
              if (uVar6 < uVar17) {
                uVar17 = uVar6;
              }
              uVar17 = uVar17 + uVar20;
              bVar3 = bVar4;
            }
          } while ((uVar20 < 0xffff) &&
                  (uVar21 = uVar8 + lVar18, lVar18 = lVar18 + uVar7, uVar20 = uVar17, bVar4 = bVar3,
                  uVar21 < uVar25));
          bVar3 = !bVar3;
        }
        else {
          uVar17 = 0;
          bVar3 = true;
        }
        if (bVar3) break;
        uVar6 = uVar6 - 1;
        *(uint *)((long)p + uVar13 * 4 + uVar7 * 4) = uVar6;
      }
      *(uint *)((long)p + uVar13 * 4) = uVar17;
      uVar15 = uVar15 + uVar17;
      uVar13 = uVar13 + 1;
      pvVar12 = (void *)((long)pvVar12 + 2);
      uVar8 = uVar8 + 1;
    } while (uVar13 != uVar7);
    pPVar9 = (PreparedDictionary *)
             BrotliAllocate(m,(4L << (bVar10 & 0x3f)) + lVar26 + (ulong)uVar15 * 4 + 0x20);
    lVar26 = uVar7 * 4;
    pPVar9->magic = 0xdebcede3;
    pPVar9->num_items = uVar15;
    pPVar9->source_size = (uint32_t)source_size;
    pPVar9->hash_bits = 0x28;
    pPVar9->bucket_bits = uVar22;
    pPVar9->slot_bits = uVar24;
    *(uint8_t **)((long)&pPVar9[1].magic + (ulong)uVar15 * 4 + uVar25 * 2 + lVar26) = source;
    uVar8 = 0;
    uVar16 = 0;
    do {
      (&pPVar9[1].magic)[uVar8] = uVar16;
      uVar16 = uVar16 + *(int *)((long)p + uVar8 * 4);
      *(undefined4 *)((long)p + uVar8 * 4) = 0;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    lVar18 = uVar25 * 2 + uVar7 * 4;
    uVar8 = 0;
    do {
      uVar13 = (ulong)(uVar14 - 1 & (uint)uVar8);
      uVar22 = *(uint *)((long)p + uVar13 * 4 + uVar7 * 4);
      uVar24 = (uint)*(ushort *)((long)__s + uVar8 * 2);
      if (uVar22 < uVar24) {
        uVar24 = uVar22;
      }
      if (uVar24 == 0) {
        *(undefined2 *)((long)&pPVar9[1].magic + uVar8 * 2 + lVar26) = 0xffff;
      }
      else {
        uVar22 = *(uint *)((long)p + uVar13 * 4);
        *(short *)((long)&pPVar9[1].magic + uVar8 * 2 + lVar26) = (short)uVar22;
        uVar15 = (&pPVar9[1].magic)[uVar13];
        *(uint *)((long)p + uVar13 * 4) = uVar22 + uVar24;
        lVar5 = uVar8 * 4 + uVar25 * 2;
        lVar1 = ((ulong)uVar15 + (ulong)uVar22) * 4;
        uVar13 = 0;
        do {
          uVar21 = uVar13;
          uVar22 = *(uint *)((long)__s + lVar5);
          *(uint *)((long)&pPVar9[1].magic + uVar21 * 4 + lVar1 + lVar18) = uVar22;
          lVar5 = (ulong)uVar22 * 4 + uVar25 * 6;
          uVar13 = uVar21 + 1;
        } while ((ulong)uVar24 != uVar21 + 1);
        *(uint *)((long)&pPVar9[1].magic + uVar21 * 4 + lVar1 + lVar18) = uVar22 | 0x80000000;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar25);
    BrotliFree(m,p);
  }
  else {
    pPVar9 = (PreparedDictionary *)0x0;
  }
  return pPVar9;
}

Assistant:

PreparedDictionary* duckdb_brotli::CreatePreparedDictionary(MemoryManager* m,
    const uint8_t* source, size_t source_size) {
  uint32_t bucket_bits = 17;
  uint32_t slot_bits = 7;
  uint32_t hash_bits = 40;
  uint16_t bucket_limit = 32;
  size_t volume = 16u << bucket_bits;
  /* Tune parameters to fit dictionary size. */
  while (volume < source_size && bucket_bits < 22) {
    bucket_bits++;
    slot_bits++;
    volume <<= 1;
  }
  return CreatePreparedDictionaryWithParams(m,
      source, source_size, bucket_bits, slot_bits, hash_bits, bucket_limit);
}